

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

boolean jtransform_request_workspace(j_decompress_ptr srcinfo,jpeg_transform_info *info)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  boolean bVar4;
  uint uVar5;
  jvirt_barray_ptr *ppjVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  jvirt_barray_ptr pjVar10;
  jpeg_transform_info *in_RSI;
  long *in_RDI;
  int v_samp_factor;
  int h_samp_factor;
  int ci;
  int itemp;
  JDIMENSION height_in_blocks;
  JDIMENSION width_in_blocks;
  JDIMENSION height_in_iMCUs;
  JDIMENSION width_in_iMCUs;
  JDIMENSION dtemp;
  JDIMENSION yoffset;
  JDIMENSION xoffset;
  jpeg_component_info *compptr;
  boolean transpose_it;
  boolean need_workspace;
  jvirt_barray_ptr *coef_arrays;
  int local_5c;
  int local_58;
  int local_54;
  uint local_38;
  uint local_34;
  
  if (((in_RSI->force_grayscale == 0) || (*(int *)((long)in_RDI + 0x3c) != 3)) ||
     ((int)in_RDI[7] != 3)) {
    in_RSI->num_components = (int)in_RDI[7];
  }
  else {
    in_RSI->num_components = 1;
  }
  *(int *)(in_RDI + 0x11) = (int)in_RDI[6];
  *(undefined4 *)((long)in_RDI + 0x8c) = *(undefined4 *)((long)in_RDI + 0x34);
  if (in_RSI->perfect != 0) {
    if (in_RSI->num_components == 1) {
      bVar4 = jtransform_perfect_transform
                        (*(JDIMENSION *)(in_RDI + 0x11),*(JDIMENSION *)((long)in_RDI + 0x8c),
                         (int)in_RDI[0x34],(int)in_RDI[0x34],in_RSI->transform);
      if (bVar4 == 0) {
        return 0;
      }
    }
    else {
      bVar4 = jtransform_perfect_transform
                        (*(JDIMENSION *)(in_RDI + 0x11),*(JDIMENSION *)((long)in_RDI + 0x8c),
                         (int)in_RDI[0x33] * (int)in_RDI[0x34],
                         *(int *)((long)in_RDI + 0x19c) * (int)in_RDI[0x34],in_RSI->transform);
      if (bVar4 == 0) {
        return 0;
      }
    }
  }
  if ((in_RSI->transform - JXFORM_TRANSPOSE < 3) || (in_RSI->transform == JXFORM_ROT_270)) {
    in_RSI->output_width = *(JDIMENSION *)((long)in_RDI + 0x8c);
    in_RSI->output_height = *(JDIMENSION *)(in_RDI + 0x11);
    if (in_RSI->num_components == 1) {
      in_RSI->iMCU_sample_width = (int)in_RDI[0x34];
      in_RSI->iMCU_sample_height = (int)in_RDI[0x34];
    }
    else {
      in_RSI->iMCU_sample_width = *(int *)((long)in_RDI + 0x19c) * (int)in_RDI[0x34];
      in_RSI->iMCU_sample_height = (int)in_RDI[0x33] * (int)in_RDI[0x34];
    }
  }
  else {
    in_RSI->output_width = *(JDIMENSION *)(in_RDI + 0x11);
    in_RSI->output_height = *(JDIMENSION *)((long)in_RDI + 0x8c);
    if (in_RSI->num_components == 1) {
      in_RSI->iMCU_sample_width = (int)in_RDI[0x34];
      in_RSI->iMCU_sample_height = (int)in_RDI[0x34];
    }
    else {
      in_RSI->iMCU_sample_width = (int)in_RDI[0x33] * (int)in_RDI[0x34];
      in_RSI->iMCU_sample_height = *(int *)((long)in_RDI + 0x19c) * (int)in_RDI[0x34];
    }
  }
  if (in_RSI->crop == 0) {
    in_RSI->x_crop_offset = 0;
    in_RSI->y_crop_offset = 0;
  }
  else {
    if (in_RSI->crop_xoffset_set == JCROP_UNSET) {
      in_RSI->crop_xoffset = 0;
    }
    if (in_RSI->crop_yoffset_set == JCROP_UNSET) {
      in_RSI->crop_yoffset = 0;
    }
    if (in_RSI->crop_width_set == JCROP_UNSET) {
      if (in_RSI->output_width <= in_RSI->crop_xoffset) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x7c;
        (**(code **)*in_RDI)(in_RDI);
      }
      in_RSI->crop_width = in_RSI->output_width - in_RSI->crop_xoffset;
    }
    else if (in_RSI->output_width < in_RSI->crop_width) {
      if (((in_RSI->transform != JXFORM_NONE) || (in_RSI->crop_width <= in_RSI->crop_xoffset)) ||
         (in_RSI->crop_width - in_RSI->output_width < in_RSI->crop_xoffset)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x7c;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    else if (((in_RSI->output_width <= in_RSI->crop_xoffset) || (in_RSI->crop_width == 0)) ||
            (in_RSI->output_width - in_RSI->crop_width < in_RSI->crop_xoffset)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x7c;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (in_RSI->crop_height_set == JCROP_UNSET) {
      if (in_RSI->output_height <= in_RSI->crop_yoffset) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x7c;
        (**(code **)*in_RDI)(in_RDI);
      }
      in_RSI->crop_height = in_RSI->output_height - in_RSI->crop_yoffset;
    }
    else if (in_RSI->output_height < in_RSI->crop_height) {
      if (((in_RSI->transform != JXFORM_NONE) || (in_RSI->crop_height <= in_RSI->crop_yoffset)) ||
         (in_RSI->crop_height - in_RSI->output_height < in_RSI->crop_yoffset)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x7c;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    else if (((in_RSI->output_height <= in_RSI->crop_yoffset) || (in_RSI->crop_height == 0)) ||
            (in_RSI->output_height - in_RSI->crop_height < in_RSI->crop_yoffset)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x7c;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (in_RSI->crop_xoffset_set == JCROP_NEG) {
      if (in_RSI->output_width < in_RSI->crop_width) {
        local_34 = (in_RSI->crop_width - in_RSI->output_width) - in_RSI->crop_xoffset;
      }
      else {
        local_34 = (in_RSI->output_width - in_RSI->crop_width) - in_RSI->crop_xoffset;
      }
    }
    else {
      local_34 = in_RSI->crop_xoffset;
    }
    if (in_RSI->crop_yoffset_set == JCROP_NEG) {
      if (in_RSI->output_height < in_RSI->crop_height) {
        local_38 = (in_RSI->crop_height - in_RSI->output_height) - in_RSI->crop_yoffset;
      }
      else {
        local_38 = (in_RSI->output_height - in_RSI->crop_height) - in_RSI->crop_yoffset;
      }
    }
    else {
      local_38 = in_RSI->crop_yoffset;
    }
    if (in_RSI->transform == JXFORM_WIPE) {
      lVar7 = jdiv_round_up((ulong)(in_RSI->crop_width + local_34 % (uint)in_RSI->iMCU_sample_width)
                            ,(long)in_RSI->iMCU_sample_width);
      in_RSI->drop_width = (JDIMENSION)lVar7;
      lVar7 = jdiv_round_up((ulong)(in_RSI->crop_height +
                                   local_38 % (uint)in_RSI->iMCU_sample_height),
                            (long)in_RSI->iMCU_sample_height);
      in_RSI->drop_height = (JDIMENSION)lVar7;
    }
    else if (in_RSI->transform == JXFORM_DROP) {
      uVar1 = in_RSI->iMCU_sample_width;
      uVar5 = (uVar1 - 1) - ((local_34 + uVar1) - 1) % uVar1;
      local_34 = uVar5 + local_34;
      if (uVar5 < in_RSI->crop_width) {
        if ((local_34 + in_RSI->crop_width) - uVar5 == in_RSI->output_width) {
          in_RSI->drop_width = (((in_RSI->crop_width - uVar5) + uVar1) - 1) / uVar1;
        }
        else {
          in_RSI->drop_width = (in_RSI->crop_width - uVar5) / uVar1;
        }
      }
      else {
        in_RSI->drop_width = 0;
      }
      uVar1 = in_RSI->iMCU_sample_height;
      uVar5 = (uVar1 - 1) - ((local_38 + uVar1) - 1) % uVar1;
      local_38 = uVar5 + local_38;
      if (uVar5 < in_RSI->crop_height) {
        if ((local_38 + in_RSI->crop_height) - uVar5 == in_RSI->output_height) {
          in_RSI->drop_height = (((in_RSI->crop_height - uVar5) + uVar1) - 1) / uVar1;
        }
        else {
          in_RSI->drop_height = (in_RSI->crop_height - uVar5) / uVar1;
        }
      }
      else {
        in_RSI->drop_height = 0;
      }
      if ((in_RSI->drop_width != 0) && (in_RSI->drop_height != 0)) {
        local_54 = 0;
        while( true ) {
          bVar2 = false;
          if (local_54 < in_RSI->num_components) {
            bVar2 = local_54 < in_RSI->drop_ptr->num_components;
          }
          if (!bVar2) break;
          if (in_RSI->drop_ptr->comp_info[local_54].h_samp_factor * (int)in_RDI[0x33] !=
              *(int *)(in_RDI[0x26] + (long)local_54 * 0x60 + 8) *
              in_RSI->drop_ptr->max_h_samp_factor) {
            *(undefined4 *)(*in_RDI + 0x28) = 0x80;
            *(int *)(*in_RDI + 0x2c) = local_54;
            *(int *)(*in_RDI + 0x30) = in_RSI->drop_ptr->comp_info[local_54].h_samp_factor;
            *(int *)(*in_RDI + 0x34) = in_RSI->drop_ptr->max_h_samp_factor;
            *(undefined4 *)(*in_RDI + 0x38) =
                 *(undefined4 *)(in_RDI[0x26] + (long)local_54 * 0x60 + 8);
            *(int *)(*in_RDI + 0x3c) = (int)in_RDI[0x33];
            *(undefined4 *)(*in_RDI + 0x40) = 0x68;
            (**(code **)*in_RDI)(in_RDI);
          }
          if (in_RSI->drop_ptr->comp_info[local_54].v_samp_factor * *(int *)((long)in_RDI + 0x19c)
              != *(int *)(in_RDI[0x26] + (long)local_54 * 0x60 + 0xc) *
                 in_RSI->drop_ptr->max_v_samp_factor) {
            *(undefined4 *)(*in_RDI + 0x28) = 0x80;
            *(int *)(*in_RDI + 0x2c) = local_54;
            *(int *)(*in_RDI + 0x30) = in_RSI->drop_ptr->comp_info[local_54].v_samp_factor;
            *(int *)(*in_RDI + 0x34) = in_RSI->drop_ptr->max_v_samp_factor;
            *(undefined4 *)(*in_RDI + 0x38) =
                 *(undefined4 *)(in_RDI[0x26] + (long)local_54 * 0x60 + 0xc);
            *(undefined4 *)(*in_RDI + 0x3c) = *(undefined4 *)((long)in_RDI + 0x19c);
            *(undefined4 *)(*in_RDI + 0x40) = 0x76;
            (**(code **)*in_RDI)(in_RDI);
          }
          local_54 = local_54 + 1;
        }
      }
    }
    else {
      if ((in_RSI->crop_width_set == JCROP_FORCE) || (in_RSI->output_width < in_RSI->crop_width)) {
        in_RSI->output_width = in_RSI->crop_width;
      }
      else {
        in_RSI->output_width = in_RSI->crop_width + local_34 % (uint)in_RSI->iMCU_sample_width;
      }
      if ((in_RSI->crop_height_set == JCROP_FORCE) || (in_RSI->output_height < in_RSI->crop_height))
      {
        in_RSI->output_height = in_RSI->crop_height;
      }
      else {
        in_RSI->output_height = in_RSI->crop_height + local_38 % (uint)in_RSI->iMCU_sample_height;
      }
    }
    in_RSI->x_crop_offset = local_34 / (uint)in_RSI->iMCU_sample_width;
    in_RSI->y_crop_offset = local_38 / (uint)in_RSI->iMCU_sample_height;
  }
  bVar2 = false;
  bVar3 = false;
  switch(in_RSI->transform) {
  case JXFORM_NONE:
    if ((((in_RSI->x_crop_offset != 0) || (in_RSI->y_crop_offset != 0)) ||
        (*(uint *)(in_RDI + 0x11) < in_RSI->output_width)) ||
       (*(uint *)((long)in_RDI + 0x8c) < in_RSI->output_height)) {
      bVar2 = true;
    }
    break;
  case JXFORM_FLIP_H:
    if (in_RSI->trim != 0) {
      trim_right_edge(in_RSI,*(JDIMENSION *)(in_RDI + 0x11));
    }
    if ((in_RSI->y_crop_offset != 0) || (in_RSI->slow_hflip != 0)) {
      bVar2 = true;
    }
    break;
  case JXFORM_FLIP_V:
    if (in_RSI->trim != 0) {
      trim_bottom_edge(in_RSI,*(JDIMENSION *)((long)in_RDI + 0x8c));
    }
    bVar2 = true;
    break;
  case JXFORM_TRANSPOSE:
    bVar2 = true;
    bVar3 = true;
    break;
  case JXFORM_TRANSVERSE:
    if (in_RSI->trim != 0) {
      trim_right_edge(in_RSI,*(JDIMENSION *)((long)in_RDI + 0x8c));
      trim_bottom_edge(in_RSI,*(JDIMENSION *)(in_RDI + 0x11));
    }
    bVar2 = true;
    bVar3 = true;
    break;
  case JXFORM_ROT_90:
    if (in_RSI->trim != 0) {
      trim_right_edge(in_RSI,*(JDIMENSION *)((long)in_RDI + 0x8c));
    }
    bVar2 = true;
    bVar3 = true;
    break;
  case JXFORM_ROT_180:
    if (in_RSI->trim != 0) {
      trim_right_edge(in_RSI,*(JDIMENSION *)(in_RDI + 0x11));
      trim_bottom_edge(in_RSI,*(JDIMENSION *)((long)in_RDI + 0x8c));
    }
    bVar2 = true;
    break;
  case JXFORM_ROT_270:
    if (in_RSI->trim != 0) {
      trim_bottom_edge(in_RSI,*(JDIMENSION *)(in_RDI + 0x11));
    }
    bVar2 = true;
    bVar3 = true;
    break;
  case JXFORM_WIPE:
    break;
  case JXFORM_DROP:
  }
  if (bVar2) {
    ppjVar6 = (jvirt_barray_ptr *)(**(code **)in_RDI[1])(in_RDI,1,(long)in_RSI->num_components << 3)
    ;
    lVar7 = jdiv_round_up((ulong)in_RSI->output_width,(long)in_RSI->iMCU_sample_width);
    lVar8 = jdiv_round_up((ulong)in_RSI->output_height,(long)in_RSI->iMCU_sample_height);
    for (local_54 = 0; local_54 < in_RSI->num_components; local_54 = local_54 + 1) {
      lVar9 = in_RDI[0x26] + (long)local_54 * 0x60;
      if (in_RSI->num_components == 1) {
        local_5c = 1;
        local_58 = 1;
      }
      else if (bVar3) {
        local_58 = *(int *)(lVar9 + 0xc);
        local_5c = *(int *)(lVar9 + 8);
      }
      else {
        local_58 = *(int *)(lVar9 + 8);
        local_5c = *(int *)(lVar9 + 0xc);
      }
      pjVar10 = (jvirt_barray_ptr)
                (**(code **)(in_RDI[1] + 0x28))
                          (in_RDI,1,0,(int)lVar7 * local_58,(int)lVar8 * local_5c,local_5c);
      ppjVar6[local_54] = pjVar10;
    }
    in_RSI->workspace_coef_arrays = ppjVar6;
  }
  else {
    in_RSI->workspace_coef_arrays = (jvirt_barray_ptr *)0x0;
  }
  return 1;
}

Assistant:

GLOBAL(boolean)
jtransform_request_workspace(j_decompress_ptr srcinfo,
                             jpeg_transform_info *info)
{
  jvirt_barray_ptr *coef_arrays;
  boolean need_workspace, transpose_it;
  jpeg_component_info *compptr;
  JDIMENSION xoffset, yoffset, dtemp;
  JDIMENSION width_in_iMCUs, height_in_iMCUs;
  JDIMENSION width_in_blocks, height_in_blocks;
  int itemp, ci, h_samp_factor, v_samp_factor;

  /* Determine number of components in output image */
  if (info->force_grayscale &&
      srcinfo->jpeg_color_space == JCS_YCbCr &&
      srcinfo->num_components == 3)
    /* We'll only process the first component */
    info->num_components = 1;
  else
    /* Process all the components */
    info->num_components = srcinfo->num_components;

  /* Compute output image dimensions and related values. */
#if JPEG_LIB_VERSION >= 80
  jpeg_core_output_dimensions(srcinfo);
#else
  srcinfo->output_width = srcinfo->image_width;
  srcinfo->output_height = srcinfo->image_height;
#endif

  /* Return right away if -perfect is given and transformation is not perfect.
   */
  if (info->perfect) {
    if (info->num_components == 1) {
      if (!jtransform_perfect_transform(srcinfo->output_width,
          srcinfo->output_height,
          srcinfo->_min_DCT_h_scaled_size,
          srcinfo->_min_DCT_v_scaled_size,
          info->transform))
        return FALSE;
    } else {
      if (!jtransform_perfect_transform(srcinfo->output_width,
          srcinfo->output_height,
          srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size,
          srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size,
          info->transform))
        return FALSE;
    }
  }

  /* If there is only one output component, force the iMCU size to be 1;
   * else use the source iMCU size.  (This allows us to do the right thing
   * when reducing color to grayscale, and also provides a handy way of
   * cleaning up "funny" grayscale images whose sampling factors are not 1x1.)
   */
  switch (info->transform) {
  case JXFORM_TRANSPOSE:
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_90:
  case JXFORM_ROT_270:
    info->output_width = srcinfo->output_height;
    info->output_height = srcinfo->output_width;
    if (info->num_components == 1) {
      info->iMCU_sample_width = srcinfo->_min_DCT_v_scaled_size;
      info->iMCU_sample_height = srcinfo->_min_DCT_h_scaled_size;
    } else {
      info->iMCU_sample_width =
        srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size;
      info->iMCU_sample_height =
        srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size;
    }
    break;
  default:
    info->output_width = srcinfo->output_width;
    info->output_height = srcinfo->output_height;
    if (info->num_components == 1) {
      info->iMCU_sample_width = srcinfo->_min_DCT_h_scaled_size;
      info->iMCU_sample_height = srcinfo->_min_DCT_v_scaled_size;
    } else {
      info->iMCU_sample_width =
        srcinfo->max_h_samp_factor * srcinfo->_min_DCT_h_scaled_size;
      info->iMCU_sample_height =
        srcinfo->max_v_samp_factor * srcinfo->_min_DCT_v_scaled_size;
    }
    break;
  }

  /* If cropping has been requested, compute the crop area's position and
   * dimensions, ensuring that its upper left corner falls at an iMCU boundary.
   */
  if (info->crop) {
    /* Insert default values for unset crop parameters */
    if (info->crop_xoffset_set == JCROP_UNSET)
      info->crop_xoffset = 0;   /* default to +0 */
    if (info->crop_yoffset_set == JCROP_UNSET)
      info->crop_yoffset = 0;   /* default to +0 */
    if (info->crop_width_set == JCROP_UNSET) {
      if (info->crop_xoffset >= info->output_width)
        ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      info->crop_width = info->output_width - info->crop_xoffset;
    } else {
      /* Check for crop extension */
      if (info->crop_width > info->output_width) {
        /* Crop extension does not work when transforming! */
        if (info->transform != JXFORM_NONE ||
            info->crop_xoffset >= info->crop_width ||
            info->crop_xoffset > info->crop_width - info->output_width)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      } else {
        if (info->crop_xoffset >= info->output_width ||
            info->crop_width <= 0 ||
            info->crop_xoffset > info->output_width - info->crop_width)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      }
    }
    if (info->crop_height_set == JCROP_UNSET) {
      if (info->crop_yoffset >= info->output_height)
        ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      info->crop_height = info->output_height - info->crop_yoffset;
    } else {
      /* Check for crop extension */
      if (info->crop_height > info->output_height) {
        /* Crop extension does not work when transforming! */
        if (info->transform != JXFORM_NONE ||
            info->crop_yoffset >= info->crop_height ||
            info->crop_yoffset > info->crop_height - info->output_height)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      } else {
        if (info->crop_yoffset >= info->output_height ||
            info->crop_height <= 0 ||
            info->crop_yoffset > info->output_height - info->crop_height)
          ERREXIT(srcinfo, JERR_BAD_CROP_SPEC);
      }
    }
    /* Convert negative crop offsets into regular offsets */
    if (info->crop_xoffset_set != JCROP_NEG)
      xoffset = info->crop_xoffset;
    else if (info->crop_width > info->output_width) /* crop extension */
      xoffset = info->crop_width - info->output_width - info->crop_xoffset;
    else
      xoffset = info->output_width - info->crop_width - info->crop_xoffset;
    if (info->crop_yoffset_set != JCROP_NEG)
      yoffset = info->crop_yoffset;
    else if (info->crop_height > info->output_height) /* crop extension */
      yoffset = info->crop_height - info->output_height - info->crop_yoffset;
    else
      yoffset = info->output_height - info->crop_height - info->crop_yoffset;
    /* Now adjust so that upper left corner falls at an iMCU boundary */
    switch (info->transform) {
    case JXFORM_DROP:
      /* Ensure the effective drop region will not exceed the requested */
      itemp = info->iMCU_sample_width;
      dtemp = itemp - 1 - ((xoffset + itemp - 1) % itemp);
      xoffset += dtemp;
      if (info->crop_width <= dtemp)
        info->drop_width = 0;
      else if (xoffset + info->crop_width - dtemp == info->output_width)
        /* Matching right edge: include partial iMCU */
        info->drop_width = (info->crop_width - dtemp + itemp - 1) / itemp;
      else
        info->drop_width = (info->crop_width - dtemp) / itemp;
      itemp = info->iMCU_sample_height;
      dtemp = itemp - 1 - ((yoffset + itemp - 1) % itemp);
      yoffset += dtemp;
      if (info->crop_height <= dtemp)
        info->drop_height = 0;
      else if (yoffset + info->crop_height - dtemp == info->output_height)
        /* Matching bottom edge: include partial iMCU */
        info->drop_height = (info->crop_height - dtemp + itemp - 1) / itemp;
      else
        info->drop_height = (info->crop_height - dtemp) / itemp;
      /* Check if sampling factors match for dropping */
      if (info->drop_width != 0 && info->drop_height != 0)
        for (ci = 0; ci < info->num_components &&
                     ci < info->drop_ptr->num_components; ci++) {
          if (info->drop_ptr->comp_info[ci].h_samp_factor *
              srcinfo->max_h_samp_factor !=
              srcinfo->comp_info[ci].h_samp_factor *
              info->drop_ptr->max_h_samp_factor)
            ERREXIT6(srcinfo, JERR_BAD_DROP_SAMPLING, ci,
              info->drop_ptr->comp_info[ci].h_samp_factor,
              info->drop_ptr->max_h_samp_factor,
              srcinfo->comp_info[ci].h_samp_factor,
              srcinfo->max_h_samp_factor, 'h');
          if (info->drop_ptr->comp_info[ci].v_samp_factor *
              srcinfo->max_v_samp_factor !=
              srcinfo->comp_info[ci].v_samp_factor *
              info->drop_ptr->max_v_samp_factor)
            ERREXIT6(srcinfo, JERR_BAD_DROP_SAMPLING, ci,
              info->drop_ptr->comp_info[ci].v_samp_factor,
              info->drop_ptr->max_v_samp_factor,
              srcinfo->comp_info[ci].v_samp_factor,
              srcinfo->max_v_samp_factor, 'v');
        }
      break;
    case JXFORM_WIPE:
      /* Ensure the effective wipe region will cover the requested */
      info->drop_width = (JDIMENSION)jdiv_round_up
        ((long)(info->crop_width + (xoffset % info->iMCU_sample_width)),
         (long)info->iMCU_sample_width);
      info->drop_height = (JDIMENSION)jdiv_round_up
        ((long)(info->crop_height + (yoffset % info->iMCU_sample_height)),
         (long)info->iMCU_sample_height);
      break;
    default:
      /* Ensure the effective crop region will cover the requested */
      if (info->crop_width_set == JCROP_FORCE ||
          info->crop_width > info->output_width)
        info->output_width = info->crop_width;
      else
        info->output_width =
          info->crop_width + (xoffset % info->iMCU_sample_width);
      if (info->crop_height_set == JCROP_FORCE ||
          info->crop_height > info->output_height)
        info->output_height = info->crop_height;
      else
        info->output_height =
          info->crop_height + (yoffset % info->iMCU_sample_height);
    }
    /* Save x/y offsets measured in iMCUs */
    info->x_crop_offset = xoffset / info->iMCU_sample_width;
    info->y_crop_offset = yoffset / info->iMCU_sample_height;
  } else {
    info->x_crop_offset = 0;
    info->y_crop_offset = 0;
  }

  /* Figure out whether we need workspace arrays,
   * and if so whether they are transposed relative to the source.
   */
  need_workspace = FALSE;
  transpose_it = FALSE;
  switch (info->transform) {
  case JXFORM_NONE:
    if (info->x_crop_offset != 0 || info->y_crop_offset != 0 ||
        info->output_width > srcinfo->output_width ||
        info->output_height > srcinfo->output_height)
      need_workspace = TRUE;
    /* No workspace needed if neither cropping nor transforming */
    break;
  case JXFORM_FLIP_H:
    if (info->trim)
      trim_right_edge(info, srcinfo->output_width);
    if (info->y_crop_offset != 0 || info->slow_hflip)
      need_workspace = TRUE;
    /* do_flip_h_no_crop doesn't need a workspace array */
    break;
  case JXFORM_FLIP_V:
    if (info->trim)
      trim_bottom_edge(info, srcinfo->output_height);
    /* Need workspace arrays having same dimensions as source image. */
    need_workspace = TRUE;
    break;
  case JXFORM_TRANSPOSE:
    /* transpose does NOT have to trim anything */
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_TRANSVERSE:
    if (info->trim) {
      trim_right_edge(info, srcinfo->output_height);
      trim_bottom_edge(info, srcinfo->output_width);
    }
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_ROT_90:
    if (info->trim)
      trim_right_edge(info, srcinfo->output_height);
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_ROT_180:
    if (info->trim) {
      trim_right_edge(info, srcinfo->output_width);
      trim_bottom_edge(info, srcinfo->output_height);
    }
    /* Need workspace arrays having same dimensions as source image. */
    need_workspace = TRUE;
    break;
  case JXFORM_ROT_270:
    if (info->trim)
      trim_bottom_edge(info, srcinfo->output_width);
    /* Need workspace arrays having transposed dimensions. */
    need_workspace = TRUE;
    transpose_it = TRUE;
    break;
  case JXFORM_WIPE:
    break;
  case JXFORM_DROP:
    break;
  }

  /* Allocate workspace if needed.
   * Note that we allocate arrays padded out to the next iMCU boundary,
   * so that transform routines need not worry about missing edge blocks.
   */
  if (need_workspace) {
    coef_arrays = (jvirt_barray_ptr *)
      (*srcinfo->mem->alloc_small) ((j_common_ptr)srcinfo, JPOOL_IMAGE,
                sizeof(jvirt_barray_ptr) * info->num_components);
    width_in_iMCUs = (JDIMENSION)
      jdiv_round_up((long)info->output_width, (long)info->iMCU_sample_width);
    height_in_iMCUs = (JDIMENSION)
      jdiv_round_up((long)info->output_height, (long)info->iMCU_sample_height);
    for (ci = 0; ci < info->num_components; ci++) {
      compptr = srcinfo->comp_info + ci;
      if (info->num_components == 1) {
        /* we're going to force samp factors to 1x1 in this case */
        h_samp_factor = v_samp_factor = 1;
      } else if (transpose_it) {
        h_samp_factor = compptr->v_samp_factor;
        v_samp_factor = compptr->h_samp_factor;
      } else {
        h_samp_factor = compptr->h_samp_factor;
        v_samp_factor = compptr->v_samp_factor;
      }
      width_in_blocks = width_in_iMCUs * h_samp_factor;
      height_in_blocks = height_in_iMCUs * v_samp_factor;
      coef_arrays[ci] = (*srcinfo->mem->request_virt_barray)
        ((j_common_ptr)srcinfo, JPOOL_IMAGE, FALSE,
         width_in_blocks, height_in_blocks, (JDIMENSION)v_samp_factor);
    }
    info->workspace_coef_arrays = coef_arrays;
  } else
    info->workspace_coef_arrays = NULL;

  return TRUE;
}